

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

bool MeCab::load_dictionary_resource(Param *param)

{
  ulong uVar1;
  string dicdir;
  string rcfile;
  char *in_stack_000003e8;
  Param *in_stack_000003f0;
  string *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  string *in_stack_ffffffffffffff20;
  allocator *file;
  allocator *path;
  allocator local_c9;
  string local_c8 [32];
  string local_a8 [39];
  allocator local_81;
  string local_80 [47];
  undefined1 in_stack_ffffffffffffffaf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  Param *in_stack_ffffffffffffffc0;
  Param *in_stack_ffffffffffffffc8;
  string local_30 [47];
  byte local_1;
  
  Param::get<std::__cxx11::string>(in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0);
  Param::get<std::__cxx11::string>(in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    std::__cxx11::string::operator=((string *)&stack0xffffffffffffffb0,".");
  }
  remove_filename(in_stack_ffffffffffffff20);
  path = &local_81;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"$(rcpath)",path);
  replace_string(in_stack_ffffffffffffff20,
                 (string *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
                 in_stack_ffffffffffffff10);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  Param::set<std::__cxx11::string>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
             (bool)in_stack_ffffffffffffffaf);
  file = &local_c9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"dicrc",file);
  create_filename((string *)path,(string *)file);
  std::__cxx11::string::operator=((string *)&stack0xffffffffffffffb0,local_a8);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::__cxx11::string::c_str();
  local_1 = Param::load(in_stack_000003f0,in_stack_000003e8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  std::__cxx11::string::~string(local_30);
  return (bool)(local_1 & 1);
}

Assistant:

bool load_dictionary_resource(Param *param) {
  std::string rcfile = param->get<std::string>("rcfile");

  /* for Open JTalk
#ifdef HAVE_GETENV
  if (rcfile.empty()) {
    const char *homedir = getenv("HOME");
    if (homedir) {
      const std::string s = MeCab::create_filename(std::string(homedir),
                                                   ".mecabrc");
      std::ifstream ifs(WPATH(s.c_str()));
      if (ifs) {
        rcfile = s;
      }
    }
  }

  if (rcfile.empty()) {
    const char *rcenv = getenv("MECABRC");
    if (rcenv) {
      rcfile = rcenv;
    }
  }
#endif

#if defined (HAVE_GETENV) && defined(_WIN32) && !defined(__CYGWIN__)
  if (rcfile.empty()) {
    scoped_fixed_array<wchar_t, BUF_SIZE> buf;
    const DWORD len = ::GetEnvironmentVariableW(L"MECABRC",
                                                buf.get(),
                                                buf.size());
    if (len < buf.size() && len > 0) {
      rcfile = WideToUtf8(buf.get());
    }
  }
#endif

#if defined(_WIN32) && !defined(__CYGWIN__)
  HKEY hKey;
  scoped_fixed_array<wchar_t, BUF_SIZE> v;
  DWORD vt;
  DWORD size = v.size() * sizeof(v[0]);

  if (rcfile.empty()) {
    ::RegOpenKeyExW(HKEY_LOCAL_MACHINE, L"software\\mecab", 0, KEY_READ, &hKey);
    ::RegQueryValueExW(hKey, L"mecabrc", 0, &vt,
                       reinterpret_cast<BYTE *>(v.get()), &size);
    ::RegCloseKey(hKey);
    if (vt == REG_SZ) {
      rcfile = WideToUtf8(v.get());
    }
  }

  if (rcfile.empty()) {
    ::RegOpenKeyExW(HKEY_CURRENT_USER, L"software\\mecab", 0, KEY_READ, &hKey);
    ::RegQueryValueExW(hKey, L"mecabrc", 0, &vt,
                       reinterpret_cast<BYTE *>(v.get()), &size);
    ::RegCloseKey(hKey);
    if (vt == REG_SZ) {
      rcfile = WideToUtf8(v.get());
    }
  }

  if (rcfile.empty()) {
    vt = ::GetModuleFileNameW(DllInstance, v.get(), size);
    if (vt != 0) {
      scoped_fixed_array<wchar_t, _MAX_DRIVE> drive;
      scoped_fixed_array<wchar_t, _MAX_DIR> dir;
      _wsplitpath(v.get(), drive.get(), dir.get(), NULL, NULL);
      const std::wstring path =
          std::wstring(drive.get()) + std::wstring(dir.get()) + L"mecabrc";
      if (::GetFileAttributesW(path.c_str()) != -1) {
        rcfile = WideToUtf8(path);
      }
    }
  }
#endif

  if (rcfile.empty()) {
    rcfile = MECAB_DEFAULT_RC;
  }

  if (!param->load(rcfile.c_str())) {
    return false;
  }
  */

  std::string dicdir = param->get<std::string>("dicdir");
  if (dicdir.empty()) {
    dicdir = ".";  // current
  }
  remove_filename(&rcfile);
  replace_string(&dicdir, "$(rcpath)", rcfile);
  param->set<std::string>("dicdir", dicdir, true);
  dicdir = create_filename(dicdir, DICRC);

  if (!param->load(dicdir.c_str())) {
    return false;
  }

  return true;
}